

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

HANDLE GetCurrentProcess(void)

{
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  return &DAT_ffffff01;
}

Assistant:

HANDLE
PALAPI
GetCurrentProcess(
          VOID)
{
    PERF_ENTRY(GetCurrentProcess);
    ENTRY("GetCurrentProcess()\n" );

    LOGEXIT("GetCurrentProcess returns HANDLE %p\n", hPseudoCurrentProcess);
    PERF_EXIT(GetCurrentProcess);

    /* return a pseudo handle */
    return hPseudoCurrentProcess;
}